

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

int __thiscall
ON_PolyCurve::GetNurbForm(ON_PolyCurve *this,ON_NurbsCurve *nurb,double tol,ON_Interval *subdomain)

{
  double dVar1;
  ON_3dPoint start_point;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  ON_Curve **ppOVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  ON_3dPoint local_108;
  undefined1 auStack_f0 [8];
  ON_3dPoint P;
  ON_3dPoint PStart;
  ON_3dPoint PEnd;
  int local_94;
  int rci;
  int i;
  ON_NurbsCurve c;
  int local_48;
  int si1;
  int si0;
  int rc;
  ON_Interval domain;
  ON_Interval *subdomain_local;
  double tol_local;
  ON_NurbsCurve *nurb_local;
  ON_PolyCurve *this_local;
  
  domain.m_t[1] = (double)subdomain;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  _si0 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  domain.m_t[0] = in_XMM1_Qa;
  bVar2 = ON_Interval::IsIncreasing((ON_Interval *)&si0);
  if (!bVar2) {
    return 0;
  }
  si1 = 0;
  local_48 = 0;
  c.m_cv._4_4_ = Count(this);
  if (domain.m_t[1] != 0.0) {
    bVar2 = ON_Interval::IsIncreasing((ON_Interval *)domain.m_t[1]);
    if (!bVar2) {
      return 0;
    }
    dVar1 = ON_Interval::Min((ON_Interval *)domain.m_t[1]);
    bVar2 = ON_Interval::Includes((ON_Interval *)&si0,dVar1,false);
    if (!bVar2) {
      return 0;
    }
    dVar1 = ON_Interval::Max((ON_Interval *)domain.m_t[1]);
    bVar2 = ON_Interval::Includes((ON_Interval *)&si0,dVar1,false);
    if (!bVar2) {
      return 0;
    }
    _si0 = *(double *)domain.m_t[1];
    domain.m_t[0] = *(double *)((long)domain.m_t[1] + 8);
  }
  while( true ) {
    bVar2 = false;
    if (local_48 < c.m_cv._4_4_) {
      pdVar4 = ON_SimpleArray<double>::operator[](&this->m_t,local_48 + 1);
      bVar2 = *pdVar4 <= _si0;
    }
    if (!bVar2) break;
    local_48 = local_48 + 1;
  }
  while( true ) {
    bVar2 = false;
    if (local_48 < c.m_cv._4_4_) {
      pdVar4 = ON_SimpleArray<double>::operator[](&this->m_t,c.m_cv._4_4_ + -1);
      bVar2 = domain.m_t[0] <= *pdVar4;
    }
    if (!bVar2) break;
    c.m_cv._4_4_ = c.m_cv._4_4_ + -1;
  }
  if (local_48 < c.m_cv._4_4_) {
    ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)&rci);
    for (local_94 = local_48; local_94 < c.m_cv._4_4_; local_94 = local_94 + 1) {
      ppOVar5 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_94);
      if (*ppOVar5 == (ON_Curve *)0x0) {
        this_local._4_4_ = 0;
        bVar2 = true;
        goto LAB_00800bb9;
      }
      if (local_94 == local_48) {
        ppOVar5 = ON_SimpleArray<ON_Curve_*>::operator[]
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_94);
        si1 = (*((*ppOVar5)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3f])
                        (SUB84(tol,0),*ppOVar5,nurb,0);
        if (si1 < 1) {
          bVar2 = true;
          this_local._4_4_ = si1;
          goto LAB_00800bb9;
        }
        pdVar4 = ON_SimpleArray<double>::operator[](&this->m_t,local_94);
        dVar1 = *pdVar4;
        pdVar4 = ON_SimpleArray<double>::operator[](&this->m_t,local_94 + 1);
        (*(nurb->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                  (SUB84(dVar1,0),*pdVar4);
      }
      else {
        ppOVar5 = ON_SimpleArray<ON_Curve_*>::operator[]
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_94);
        iVar3 = (*((*ppOVar5)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3f])
                          (SUB84(tol,0),*ppOVar5,&rci,0);
        if (iVar3 < 1) {
          bVar2 = true;
          this_local._4_4_ = iVar3;
          goto LAB_00800bb9;
        }
        if (si1 < iVar3) {
          si1 = iVar3;
        }
        pdVar4 = ON_SimpleArray<double>::operator[](&this->m_t,local_94);
        dVar1 = *pdVar4;
        pdVar4 = ON_SimpleArray<double>::operator[](&this->m_t,local_94 + 1);
        ON_NurbsCurve::SetDomain((ON_NurbsCurve *)&rci,dVar1,*pdVar4);
        ON_Curve::PointAtEnd((ON_3dPoint *)&PStart.z,&nurb->super_ON_Curve);
        ON_Curve::PointAtStart((ON_3dPoint *)&P.z,(ON_Curve *)&rci);
        ON_3dPoint::operator+(&local_108,(ON_3dPoint *)&PStart.z,(ON_3dPoint *)&P.z);
        ::operator*((ON_3dPoint *)auStack_f0,0.5,&local_108);
        (*(nurb->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3a])();
        start_point.y._0_4_ = SUB84(P.x,0);
        start_point.x = (double)auStack_f0;
        start_point.y._4_4_ = (int)((ulong)P.x >> 0x20);
        start_point.z = P.y;
        ON_NurbsCurve::SetStartPoint((ON_NurbsCurve *)&rci,start_point);
        bVar2 = ON_NurbsCurve::Append(nurb,(ON_NurbsCurve *)&rci);
        if (!bVar2) {
          this_local._4_4_ = 0;
          bVar2 = true;
          goto LAB_00800bb9;
        }
        ON_NurbsCurve::Destroy((ON_NurbsCurve *)&rci);
      }
    }
    bVar2 = false;
LAB_00800bb9:
    ON_NurbsCurve::~ON_NurbsCurve((ON_NurbsCurve *)&rci);
    if (!bVar2) {
      if (domain.m_t[1] != 0.0) {
        (*(nurb->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3c])
                  (nurb,domain.m_t[1]);
      }
      this_local._4_4_ = si1;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int ON_PolyCurve::GetNurbForm( 
                              ON_NurbsCurve& nurb, 
                              double tol,
                              const ON_Interval* subdomain  // OPTIONAL subdomain of ON::ProxyCurve::Domain()
                              ) const
{
  ON_Interval domain = Domain();
  if ( !domain.IsIncreasing() )
    return false;
  int rc = 0;
  int si0 = 0;
  int si1 = Count();
  if ( subdomain ) {
    if ( !subdomain->IsIncreasing() )
      return 0;
    if ( !domain.Includes(subdomain->Min()) )
      return 0;
    if ( !domain.Includes(subdomain->Max()) )
      return 0;
    domain = *subdomain;
  }

  while ( si0 < si1 && m_t[si0+1] <= domain.m_t[0] )
    si0++;
  while ( si0 < si1 && m_t[si1-1] >= domain.m_t[1] )
    si1--;
  if ( si0 >= si1 )
    return 0;
  {
    ON_NurbsCurve c;
    int i, rci;
    for ( i = si0; i < si1; i++ ) {
      if ( !m_segment[i] )
        return 0;
      if ( i == si0 ) {
        rc = m_segment[i]->GetNurbForm( nurb, tol, nullptr );
        if ( rc < 1 )
          return rc;
        nurb.SetDomain( m_t[i], m_t[i+1] );
      }
      else {
        rci = m_segment[i]->GetNurbForm( c, tol, nullptr );
        if ( rci < 1 )
          return rci;
        else if ( rc < rci )
          rc = rci;
        c.SetDomain( m_t[i], m_t[i+1] );
        ON_3dPoint PEnd = nurb.PointAtEnd();
        ON_3dPoint PStart = c.PointAtStart();
        ON_3dPoint P = 0.5*(PEnd+PStart);
        nurb.SetEndPoint(P);
        c.SetStartPoint(P);
        if ( !nurb.Append( c ) )
          return 0;
        c.Destroy();
      }
    }
  }

  if ( subdomain )
    nurb.Trim( *subdomain );

  return rc;
}